

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address_test.cpp
# Opt level: O2

void __thiscall
ot::commissioner::AddressTest_AddressFromSockaddr_Ipv4SocketAddress_Test::
~AddressTest_AddressFromSockaddr_Ipv4SocketAddress_Test
          (AddressTest_AddressFromSockaddr_Ipv4SocketAddress_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(AddressTest, AddressFromSockaddr_Ipv4SocketAddress)
{
    Address     addr;
    sockaddr_in sockaddr;
    memset(&sockaddr, 0, sizeof(sockaddr));
    sockaddr.sin_family      = AF_INET;
    sockaddr.sin_addr.s_addr = htonl(INADDR_LOOPBACK);
    sockaddr.sin_port        = htons(5684);

    EXPECT_EQ(addr.Set(*reinterpret_cast<sockaddr_storage *>(&sockaddr)), ErrorCode::kNone);
    EXPECT_TRUE(addr.IsValid());
    EXPECT_TRUE(addr.IsIpv4());

    EXPECT_EQ(addr.ToString(), "127.0.0.1");
}